

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O2

void __thiscall RVO::KdTree::buildAgentTree(KdTree *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  pointer ppAVar3;
  pointer ppAVar4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  
  ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppAVar3 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar5 = (long)ppAVar3 - (long)ppAVar2;
  ppAVar4 = (this->sim_->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (this->sim_->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (uVar5 < (ulong)((long)ppAVar1 - (long)ppAVar4)) {
    for (uVar6 = (long)uVar5 >> 3; uVar6 < (ulong)((long)ppAVar1 - (long)ppAVar4 >> 3);
        uVar6 = uVar6 + 1) {
      std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::push_back
                (&this->agents_,(value_type *)((long)ppAVar4 + uVar5));
      ppAVar4 = (this->sim_->agents_).
                super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar1 = (this->sim_->agents_).
                super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar5 = uVar5 + 8;
    }
    std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::resize
              (&this->agentTree_,
               ((long)(this->agents_).
                      super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->agents_).
                      super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) - 1);
    ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppAVar3 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (ppAVar2 != ppAVar3) {
    buildAgentTreeRecursive(this,0,(long)ppAVar3 - (long)ppAVar2 >> 3,0);
    return;
  }
  return;
}

Assistant:

void KdTree::buildAgentTree()
	{
		if (agents_.size() < sim_->agents_.size()) {
			for (size_t i = agents_.size(); i < sim_->agents_.size(); ++i) {
				agents_.push_back(sim_->agents_[i]);
			}

			agentTree_.resize(2 * agents_.size() - 1);
		}

		if (!agents_.empty()) {
			buildAgentTreeRecursive(0, agents_.size(), 0);
		}
	}